

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O3

void __thiscall
StringType::GenDynamicSizeAnyStr(StringType *this,Output *out_cc,Env *env,DataPtr *data)

{
  char *pcVar1;
  char *pcVar2;
  Exception *this_00;
  ID *pIVar3;
  string local_50;
  
  if ((((this->super_Type).attr_restofdata_ == false) && ((this->super_Type).attr_oneline_ != true))
     && ((this->super_Type).attr_restofflow_ != true)) {
    if ((this->super_Type).attr_length_expr_ == (Expr *)0x0) {
      this_00 = (Exception *)__cxa_allocate_exception(0x20);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"cannot determine length of bytestring","");
      Exception::Exception(this_00,&(this->super_Type).super_Object,&local_50);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    if (this->string_length_var_field_ == (Field *)0x0) {
      pIVar3 = (ID *)0x0;
    }
    else {
      pIVar3 = this->string_length_var_field_->id_;
    }
    pcVar1 = Env::LValue(env,pIVar3);
    pcVar2 = Expr::EvalExpr((this->super_Type).attr_length_expr_,out_cc,env);
    Output::println(out_cc,"%s = %s;",pcVar1,pcVar2);
  }
  else {
    if (this->string_length_var_field_ == (Field *)0x0) {
      pIVar3 = (ID *)0x0;
    }
    else {
      pIVar3 = this->string_length_var_field_->id_;
    }
    pcVar1 = Env::LValue(env,pIVar3);
    pcVar2 = Env::RValue(env,end_of_data);
    Output::println(out_cc,"%s = (%s) - (%s);",pcVar1,pcVar2,(data->ptr_expr_)._M_dataplus._M_p);
  }
  if (this->string_length_var_field_ == (Field *)0x0) {
    pIVar3 = (ID *)0x0;
  }
  else {
    pIVar3 = this->string_length_var_field_->id_;
  }
  Env::SetEvaluated(env,pIVar3,true);
  return;
}

Assistant:

void StringType::GenDynamicSizeAnyStr(Output* out_cc, Env* env, const DataPtr& data)
	{
	ASSERT(type_ == ANYSTR);

	if ( attr_restofdata_ || attr_oneline_ )
		{
		out_cc->println("%s = (%s) - (%s);", env->LValue(string_length_var()),
		                env->RValue(end_of_data), data.ptr_expr());
		}
	else if ( attr_restofflow_ )
		{
		out_cc->println("%s = (%s) - (%s);", env->LValue(string_length_var()),
		                env->RValue(end_of_data), data.ptr_expr());
		}
	else if ( attr_length_expr_ )
		{
		out_cc->println("%s = %s;", env->LValue(string_length_var()),
		                attr_length_expr_->EvalExpr(out_cc, env));
		}
	else
		{
		throw Exception(this, "cannot determine length of bytestring");
		}

	env->SetEvaluated(string_length_var());
	}